

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O0

int __thiscall
CVmObjBigNum::getp_rad2deg(CVmObjBigNum *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  int iVar1;
  uint uVar2;
  undefined8 *puVar3;
  long *plVar4;
  char *in_RDI;
  err_frame_t err_cur__;
  char *pi;
  char *ext1;
  uint hdl1;
  size_t prec;
  char *new_ext;
  undefined8 in_stack_fffffffffffffec0;
  int round;
  undefined8 uVar5;
  uint in_stack_fffffffffffffed4;
  void *local_120;
  char **in_stack_fffffffffffffee8;
  unsigned_long *in_stack_fffffffffffffef0;
  vm_val_t *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  vm_obj_id_t in_stack_ffffffffffffff04;
  CVmObjBigNum *in_stack_ffffffffffffff08;
  undefined1 local_48 [12];
  uint local_3c;
  size_t local_38;
  
  round = (int)((ulong)in_stack_fffffffffffffec0 >> 0x20);
  local_38 = get_prec((char *)0x2b3d1c);
  iVar1 = setup_getp_0(in_stack_ffffffffffffff08,in_stack_ffffffffffffff04,in_stack_fffffffffffffef8
                       ,(uint *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  if (iVar1 == 0) {
    cache_pi(err_cur__.jmpbuf_[0].__jmpbuf[0]);
    alloc_temp_regs(local_38 + 2,1,local_48,&local_3c);
    puVar3 = (undefined8 *)_ZTW11G_err_frame();
    uVar5 = *puVar3;
    plVar4 = (long *)_ZTW11G_err_frame();
    *plVar4 = (long)&stack0xfffffffffffffed0;
    uVar2 = _setjmp((__jmp_buf_tag *)&stack0xfffffffffffffee8);
    if (uVar2 == 0) {
      copy_val((char *)((ulong)in_stack_fffffffffffffed4 << 0x20),in_RDI,round);
      div_by_long((char *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                  (unsigned_long)in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
      compute_quotient_into
                ((char *)err_cur__.jmpbuf_[0].__saved_mask.__val[5],
                 (char *)err_cur__.jmpbuf_[0].__saved_mask.__val[4],
                 (char *)err_cur__.jmpbuf_[0].__saved_mask.__val[3],
                 (char *)err_cur__.jmpbuf_[0].__saved_mask.__val[2]);
    }
    if ((uVar2 & 0x8000) == 0) {
      release_temp_regs(1,(ulong)local_3c);
    }
    puVar3 = (undefined8 *)_ZTW11G_err_frame();
    *puVar3 = uVar5;
    if ((uVar2 & 0x4001) != 0) {
      puVar3 = (undefined8 *)_ZTW11G_err_frame();
      if ((*(uint *)*puVar3 & 2) != 0) {
        plVar4 = (long *)_ZTW11G_err_frame();
        free(*(void **)(*plVar4 + 0x10));
      }
      plVar4 = (long *)_ZTW11G_err_frame();
      *(void **)(*plVar4 + 0x10) = local_120;
      err_rethrow();
    }
    if ((uVar2 & 2) != 0) {
      free(local_120);
    }
    CVmStack::discard();
  }
  return 1;
}

Assistant:

int CVmObjBigNum::getp_rad2deg(VMG_ vm_obj_id_t self,
                               vm_val_t *retval, uint *argc)
{
    char *new_ext;
    size_t prec = get_prec(ext_);
    uint hdl1;
    char *ext1;
    const char *pi;

    /* check arguments and set up the result */
    if (setup_getp_0(vmg_ self, retval, argc, &new_ext))
        return TRUE;

    /* cache pi to our working precision */
    pi = cache_pi(prec + 2);

    /* allocate a temporary register for pi/180 */
    alloc_temp_regs(prec + 2, 1, &ext1, &hdl1);

    /* catch errors so we can be sure to free registers */
    err_try
    {
        /* get pi to our precision */
        copy_val(ext1, pi, TRUE);

        /* divide pi by 180 */
        div_by_long(ext1, 180);

        /* divide by pi/180 */
        compute_quotient_into(new_ext, 0, ext_, ext1);
    }